

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,
          TPZVec<long> *nodeindices,int matind,TPZGeoMesh *mesh)

{
  TPZRegisterClassId *in_RDI;
  TPZGeoMesh *in_stack_00000020;
  int in_stack_0000002c;
  TPZVec<long> *in_stack_00000030;
  undefined4 in_stack_00000040;
  TPZAutoPointer<TPZRefPattern> *in_stack_ffffffffffffffc0;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02469e78);
  TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::TPZGeoElRefLess
            ((TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *)
             CONCAT44(matind,in_stack_00000040),(void **)mesh,in_stack_00000030,in_stack_0000002c,
             in_stack_00000020);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_02469b50;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_02469b50;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x168));
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(nodeindices,matind,mesh) {
}